

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkStartRead(char *pName)

{
  Abc_Ntk_t *pAVar1;
  char *pcVar2;
  
  pAVar1 = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_SOP,1);
  pcVar2 = Extra_FileNameGeneric(pName);
  pAVar1->pName = pcVar2;
  pcVar2 = Extra_UtilStrsav(pName);
  pAVar1->pSpec = pcVar2;
  pcVar2 = pAVar1->pName;
  if (pcVar2 != (char *)0x0) {
    if (*pcVar2 != '\0') {
      return pAVar1;
    }
    if (pcVar2 != (char *)0x0) {
      free(pcVar2);
      pAVar1->pName = (char *)0x0;
    }
  }
  pcVar2 = Extra_UtilStrsav("unknown");
  pAVar1->pName = pcVar2;
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkStartRead( char * pName )
{
    Abc_Ntk_t * pNtkNew; 
    // allocate the empty network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_NETLIST, ABC_FUNC_SOP, 1 );
    // set the specs
    pNtkNew->pName = Extra_FileNameGeneric(pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pName);
    if ( pNtkNew->pName == NULL || strlen(pNtkNew->pName) == 0 )
    {
        ABC_FREE( pNtkNew->pName );
        pNtkNew->pName = Extra_UtilStrsav("unknown");
    }
    return pNtkNew;
}